

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O3

size_type __thiscall
lf::mesh::hybrid2d::MeshFactory::AddEntity
          (MeshFactory *this,RefEl ref_el,span<const_unsigned_int,_18446744073709551615UL> *nodes,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Geometry *pGVar3;
  size_t sVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  dim_t dVar8;
  dim_t dVar9;
  int iVar10;
  size_type sVar11;
  long lVar12;
  ostream *poVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  array<unsigned_int,_4UL> ns;
  stringstream ss;
  RefEl local_239;
  string local_238;
  string local_218;
  string local_1f8;
  array<unsigned_int,_4UL> local_1d8;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_239.type_ = ref_el.type_;
  dVar8 = lf::base::internal::DimensionImpl(ref_el.type_);
  if (dVar8 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Use AddPoint() to add a node to a mesh.",0x27);
    paVar1 = &local_238.field_2;
    local_238._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"ref_el.Dimension() > 0","");
    paVar2 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_238,&local_218,0x31,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_238._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,"");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
    lf::base::AssertionFailed(&local_238,&local_218,0x31,&local_1f8);
  }
  else {
    dVar8 = lf::base::internal::DimensionImpl(ref_el.type_);
    if (dVar8 < 3) {
      pGVar3 = (geometry->_M_t).
               super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
               ._M_t.
               super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
               .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
      if (pGVar3 != (Geometry *)0x0) {
        dVar9 = (*pGVar3->_vptr_Geometry[1])();
        if (dVar9 != this->dim_world_) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"geometry->DimGlobal() != dim_world_",0x23);
          paVar1 = &local_238.field_2;
          local_238._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"geometry->DimGlobal() == dim_world_","");
          paVar2 = &local_218.field_2;
          local_218._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed(&local_238,&local_218,0x35,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar1) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          local_238._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
          local_218._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                     ,"");
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          lf::base::AssertionFailed(&local_238,&local_218,0x35,&local_1f8);
          goto LAB_00156136;
        }
        iVar10 = (*((geometry->_M_t).
                    super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                    .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl)->
                   _vptr_Geometry[2])();
        if ((RefElType)iVar10 != ref_el.type_) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"ref_el != geometry->RefEl()",0x1b);
          paVar1 = &local_238.field_2;
          local_238._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"geometry->RefEl() == ref_el","");
          paVar2 = &local_218.field_2;
          local_218._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed(&local_238,&local_218,0x36,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar1) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          local_238._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
          local_218._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                     ,"");
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          lf::base::AssertionFailed(&local_238,&local_218,0x36,&local_1f8);
          goto LAB_00156136;
        }
      }
      if (ref_el.type_ == kSegment) {
        local_1d8._M_elems[0] = 0;
        local_1d8._M_elems[1] = 0;
        sVar4 = (nodes->_M_extent)._M_extent_value;
        if (sVar4 == 0) {
          lVar16 = 0;
        }
        else {
          puVar5 = (this->nodes_).
                   super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar6 = (this->nodes_).
                   super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar7 = nodes->_M_ptr;
          lVar12 = sVar4 << 2;
          lVar16 = 0;
          do {
            if ((ulong)((long)puVar5 - (long)puVar6 >> 3) <= (ulong)puVar7[lVar16]) {
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"node ",5);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,
                         " specified in call to AddEntity must be inserted with AddPoint() first.",
                         0x47);
              paVar1 = &local_238.field_2;
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_238,"n < nodes_.size()","");
              paVar2 = &local_218.field_2;
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              lf::base::AssertionFailed(&local_238,&local_218,0x41,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
              lf::base::AssertionFailed(&local_238,&local_218,0x41,&local_1f8);
              goto LAB_00156136;
            }
            if (lVar16 == 2) {
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"ref_el = segment, but nodes contains more than 2 node indices",
                         0x3d);
              paVar1 = &local_238.field_2;
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"count < 2","");
              paVar2 = &local_218.field_2;
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              lf::base::AssertionFailed(&local_238,&local_218,0x44,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
              lf::base::AssertionFailed(&local_238,&local_218,0x44,&local_1f8);
              goto LAB_00156136;
            }
            local_1d8._M_elems[lVar16] = puVar7[lVar16];
            lVar16 = lVar16 + 1;
            lVar12 = lVar12 + -4;
          } while (lVar12 != 0);
          if (lVar16 == 2) {
            std::
            vector<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
            ::
            emplace_back<std::array<unsigned_int,2ul>&,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                      ((vector<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
                        *)&this->edges_,(array<unsigned_int,_2UL> *)&local_1d8,geometry);
            iVar10 = (int)((long)(this->edges_).
                                 super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->edges_).
                                 super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
            goto LAB_00155fdf;
          }
        }
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"ref_el = segment but size of nodes was ",0x27);
        local_238._M_dataplus._M_p._0_1_ = (char)lVar16;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
        paVar1 = &local_238.field_2;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"count == 2","");
        paVar2 = &local_218.field_2;
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_238,&local_218,0x49,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,"");
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        lf::base::AssertionFailed(&local_238,&local_218,0x49,&local_1f8);
      }
      else {
        local_1d8._M_elems[0] = 0;
        local_1d8._M_elems[1] = 0;
        local_1d8._M_elems[2] = 0;
        local_1d8._M_elems[3] = 0;
        sVar4 = (nodes->_M_extent)._M_extent_value;
        if (sVar4 == 0) {
          uVar15 = 0;
        }
        else {
          puVar7 = nodes->_M_ptr;
          lVar16 = sVar4 << 2;
          uVar15 = 0;
          local_1c0 = geometry;
          do {
            uVar14 = (uint)uVar15 & 0xff;
            sVar11 = lf::base::RefEl::NumNodes(&local_239);
            if (sVar11 <= uVar14) {
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ref_el = ",9);
              poVar13 = lf::base::operator<<(local_1a8,&local_239);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,", but nodes contains ",0x15);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar14 + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"node indices",0xc);
              paVar1 = &local_238.field_2;
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_238,"count < ref_el.NumNodes()","");
              paVar2 = &local_218.field_2;
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              lf::base::AssertionFailed(&local_238,&local_218,0x55,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
              lf::base::AssertionFailed(&local_238,&local_218,0x55,&local_1f8);
              goto LAB_00156136;
            }
            if ((ulong)((long)(this->nodes_).
                              super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->nodes_).
                              super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <=
                (ulong)puVar7[uVar15]) {
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8," Node ",6);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," for ",5);
              lf::base::RefEl::ToString_abi_cxx11_(&local_238,&local_239);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"  must be inserted with AddNode() first.",0x28);
              paVar1 = &local_238.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_238,"n < nodes_.size()","");
              paVar2 = &local_218.field_2;
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              lf::base::AssertionFailed(&local_238,&local_218,0x58,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != paVar1) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              local_238._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
              local_218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                         ,"");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
              lf::base::AssertionFailed(&local_238,&local_218,0x58,&local_1f8);
              goto LAB_00156136;
            }
            local_1d8._M_elems[uVar15 & 0xff] = puVar7[uVar15];
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + -4;
            geometry = local_1c0;
          } while (lVar16 != 0);
        }
        sVar11 = lf::base::RefEl::NumNodes(&local_239);
        if (sVar11 == ((uint)uVar15 & 0xff)) {
          if ((char)uVar15 == '\x03') {
            local_1d8._M_elems[3] = 0xffffffff;
          }
          std::
          vector<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
          ::
          emplace_back<std::array<unsigned_int,4ul>&,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                    ((vector<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
                      *)&this->elements_,&local_1d8,geometry);
          iVar10 = (int)((long)(this->elements_).
                               super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->elements_).
                               super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
LAB_00155fdf:
          return iVar10 - 1;
        }
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ref_el.NumNodes() = ",0x14);
        lf::base::RefEl::NumNodes(&local_239);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,", but argument nodes contained ",0x1f);
        local_238._M_dataplus._M_p._0_1_ = (char)uVar15;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_238,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," nodes",6);
        paVar1 = &local_238.field_2;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"count == ref_el.NumNodes()","");
        paVar2 = &local_218.field_2;
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        lf::base::AssertionFailed(&local_238,&local_218,0x5f,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,"");
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        lf::base::AssertionFailed(&local_238,&local_218,0x5f,&local_1f8);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ref_el.Dimension > 2",0x14);
      paVar1 = &local_238.field_2;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"ref_el.Dimension() <= 2","");
      paVar2 = &local_218.field_2;
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_238,&local_218,0x32,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,"");
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
      lf::base::AssertionFailed(&local_238,&local_218,0x32,&local_1f8);
    }
  }
LAB_00156136:
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  abort();
}

Assistant:

MeshFactory::size_type MeshFactory::AddEntity(
    base::RefEl ref_el, const std::span<const size_type>& nodes,
    std::unique_ptr<geometry::Geometry>&& geometry) {
  LF_ASSERT_MSG(ref_el.Dimension() > 0,
                "Use AddPoint() to add a node to a mesh.");
  LF_ASSERT_MSG(ref_el.Dimension() <= 2, "ref_el.Dimension > 2");
  if (geometry != nullptr) {
    LF_ASSERT_MSG(geometry->DimGlobal() == dim_world_,
                  "geometry->DimGlobal() != dim_world_");
    LF_ASSERT_MSG(geometry->RefEl() == ref_el, "ref_el != geometry->RefEl()");
  }

  // Add an edge
  if (ref_el == base::RefEl::kSegment()) {
    std::array<size_type, 2> ns{};
    unsigned char count = 0;
    for (const auto& n : nodes) {
      LF_ASSERT_MSG(n < nodes_.size(),
                    "node " << n
                            << " specified in call to AddEntity must be "
                               "inserted with AddPoint() first.");
      LF_ASSERT_MSG(
          count < 2,
          "ref_el = segment, but nodes contains more than 2 node indices");
      ns[count] = n;
      ++count;
    }
    LF_ASSERT_MSG(count == 2,
                  "ref_el = segment but size of nodes was " << count);
    edges_.emplace_back(ns, std::move(geometry));
    return edges_.size() - 1;
  }  // end insertion of an edge

  // otherwise its an element:
  // LF_ASSERT_MSG(geometry, "Geometry is required for elements (codim=0)");
  std::array<size_type, 4> ns{};
  unsigned char count = 0;
  for (const auto& n : nodes) {
    LF_ASSERT_MSG(count < ref_el.NumNodes(),
                  "ref_el = " << ref_el << ", but nodes contains " << count + 1
                              << "node indices");
    LF_ASSERT_MSG(n < nodes_.size(),
                  " Node " << n << " for " << ref_el.ToString()
                           << "  must be inserted with AddNode() first.");
    ns[count] = n;
    ++count;
  }
  LF_ASSERT_MSG(count == ref_el.NumNodes(),
                "ref_el.NumNodes() = " << ref_el.NumNodes()
                                       << ", but argument nodes contained "
                                       << count << " nodes");

  // if we have added a triangle, set the fourth node to -1.
  if (count == 3) {
    ns[3] = -1;
  }
  elements_.emplace_back(ns, std::move(geometry));
  return elements_.size() - 1;
}